

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O0

void __thiscall ImplSimd<SimdSSE2>::AlphaBlend(ImplSimd<SimdSSE2> *this,RGB *rgb,uint8_t alpha)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  longlong local_e8 [2];
  longlong local_d8 [2];
  longlong local_c8 [2];
  longlong local_b8 [2];
  longlong local_a8 [2];
  longlong local_98 [2];
  longlong lStack_88;
  Vector e;
  Vector d;
  Vector c;
  ulong local_50;
  size_t i;
  Vector const_alpha;
  uint8_t *b;
  uint8_t *g;
  uint8_t *r;
  uint8_t alpha_local;
  RGB *rgb_local;
  ImplSimd<SimdSSE2> *this_local;
  
  if ((rgb->size_ & 7) == 0) {
    puVar1 = rgb->r_;
    puVar2 = rgb->g_;
    const_alpha[1] = (longlong)rgb->b_;
    SimdSSE2::Constant((ushort)alpha);
    for (local_50 = 0; local_50 < rgb->size_; local_50 = local_50 + 8) {
      SimdSSE2::Load(puVar1 + local_50);
      SimdSSE2::Load(puVar2 + local_50);
      SimdSSE2::Load((uint8_t *)(const_alpha[1] + local_50));
      SimdSSE2::Mul((VectorType *)&i,(VectorType *)(d + 1));
      SimdSSE2::Rli(&local_a8,8);
      SimdSSE2::Store(&local_98,puVar1 + local_50);
      SimdSSE2::Mul((VectorType *)&i,(VectorType *)(e + 1));
      SimdSSE2::Rli(&local_c8,8);
      SimdSSE2::Store(&local_b8,puVar2 + local_50);
      SimdSSE2::Mul((VectorType *)&i,(VectorType *)&lStack_88);
      SimdSSE2::Rli(&local_e8,8);
      SimdSSE2::Store(&local_d8,(uint8_t *)(const_alpha[1] + local_50));
      SimdSSE2::Empty();
    }
    return;
  }
  __assert_fail("rgb->size_ % kStride == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,0x5b,
                "virtual void ImplSimd<SimdSSE2>::AlphaBlend(RGB *, uint8_t) [SIMD = SimdSSE2]");
}

Assistant:

void ImplSimd<SIMD>::AlphaBlend(RGB *rgb, uint8_t alpha) {
  assert(rgb->size_ % kStride == 0);

  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  Vector const_alpha = cn(alpha);

  for(size_t i = 0; i < rgb->size_; i += kStride){
    Vector c = load(r+i);
    Vector d = load(g+i);
    Vector e = load(b+i);
    /*
    r[i] = (uint32_t)alpha * r[i] >> 8;
    g[i] = (uint32_t)alpha * g[i] >> 8;
    b[i] = (uint32_t)alpha * b[i] >> 8;
     */
    store(rli(mul(const_alpha, c),8),r+i);
    store(rli(mul(const_alpha, d),8),g+i);
    store(rli(mul(const_alpha, e),8),b+i);
    SIMD::Empty();
  }
}